

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O3

uint32 __thiscall Js::RecyclableTypedArrayWalker::GetChildrenCount(RecyclableTypedArrayWalker *this)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  TypedArrayBase *pTVar6;
  
  uVar4 = (this->super_RecyclableArrayWalker).indexedItemCount;
  if (uVar4 == 0) {
    bVar3 = VarIs<Js::TypedArrayBase>
                      ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xcc6,"(Js::VarIs<Js::TypedArrayBase>(instance))",
                                  "Js::VarIs<Js::TypedArrayBase>(instance)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    pTVar6 = VarTo<Js::TypedArrayBase>
                       ((this->super_RecyclableArrayWalker).super_RecyclableObjectWalker.instance);
    TVar1 = (pTVar6->super_ArrayBufferParent).super_ArrayObject.length;
    uVar4 = 0;
    if ((this->super_RecyclableArrayWalker).fOnlyOwnProperties == false) {
      uVar4 = RecyclableObjectWalker::GetChildrenCount((RecyclableObjectWalker *)this);
    }
    uVar4 = uVar4 + TVar1;
    (this->super_RecyclableArrayWalker).indexedItemCount = uVar4;
  }
  return uVar4;
}

Assistant:

uint32 RecyclableTypedArrayWalker::GetChildrenCount()
    {
        if (!indexedItemCount)
        {
            Assert(Js::VarIs<Js::TypedArrayBase>(instance));

            Js::TypedArrayBase * typedArrayObj = Js::VarTo<Js::TypedArrayBase>(instance);

            indexedItemCount = typedArrayObj->GetLength() + (!fOnlyOwnProperties ? RecyclableObjectWalker::GetChildrenCount() : 0);
        }

        return indexedItemCount;
    }